

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O2

void __thiscall FilereaderLp::writeToFile(FilereaderLp *this,FILE *file,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argptr;
  undefined1 local_318 [24];
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  array<char,_561UL> stringbuffer;
  
  argptr[0].reg_save_area = local_318;
  if (in_AL != '\0') {
    local_2e8 = in_XMM0_Qa;
    local_2d8 = in_XMM1_Qa;
    local_2c8 = in_XMM2_Qa;
    local_2b8 = in_XMM3_Qa;
    local_2a8 = in_XMM4_Qa;
    local_298 = in_XMM5_Qa;
    local_288 = in_XMM6_Qa;
    local_278 = in_XMM7_Qa;
  }
  argptr[0].overflow_arg_area = &stack0x00000008;
  argptr[0].gp_offset = 0x18;
  argptr[0].fp_offset = 0x30;
  local_300 = in_RCX;
  local_2f8 = in_R8;
  local_2f0 = in_R9;
  memset(&stringbuffer,0,0x231);
  iVar1 = vsnprintf(stringbuffer._M_elems,0x231,format,argptr);
  if (iVar1 + this->linelength < 0x230) {
    fputs(stringbuffer._M_elems,(FILE *)file);
    iVar1 = iVar1 + this->linelength;
  }
  else {
    fputc(10,(FILE *)file);
    fputs(stringbuffer._M_elems,(FILE *)file);
  }
  this->linelength = iVar1;
  return;
}

Assistant:

void FilereaderLp::writeToFile(FILE* file, const char* format, ...) {
  va_list argptr;
  va_start(argptr, format);
  std::array<char, LP_MAX_LINE_LENGTH + 1> stringbuffer = {};
  HighsInt tokenlength =
      vsnprintf(stringbuffer.data(), stringbuffer.size(), format, argptr);
  va_end(argptr);
  if (this->linelength + tokenlength >= LP_MAX_LINE_LENGTH) {
    fprintf(file, "\n");
    fprintf(file, "%s", stringbuffer.data());
    this->linelength = tokenlength;
  } else {
    fprintf(file, "%s", stringbuffer.data());
    this->linelength += tokenlength;
  }
}